

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O2

void __thiscall
Am_Value_List_Data::Insert
          (Am_Value_List_Data *this,Am_Value *value,Am_List_Item *current,
          Am_Insert_Position position)

{
  undefined1 *puVar1;
  Am_List_Item *this_00;
  Am_List_Item **ppAVar2;
  Am_List_Item *pAVar3;
  Am_List_Item **ppAVar4;
  Am_List_Item **ppAVar5;
  
  puVar1 = &(this->super_Am_Wrapper).field_0xc;
  *(short *)puVar1 = *(short *)puVar1 + 1;
  this_00 = (Am_List_Item *)operator_new(0x20);
  (this_00->super_Am_Value).type = 0;
  (this_00->super_Am_Value).value.wrapper_value = (Am_Wrapper *)0x0;
  this_00->prev = (Am_List_Item *)0x0;
  this_00->next = (Am_List_Item *)0x0;
  Am_Value::operator=((Am_Value *)this_00,value);
  if (current == (Am_List_Item *)0x0) {
    if (position == Am_BEFORE) {
      this_00->next = (Am_List_Item *)0x0;
      ppAVar2 = &this->tail;
      pAVar3 = this->tail;
      this_00->prev = pAVar3;
      ppAVar5 = &this->head;
      ppAVar4 = &pAVar3->next;
    }
    else {
      this_00->prev = (Am_List_Item *)0x0;
      ppAVar2 = &this->head;
      pAVar3 = this->head;
      this_00->next = pAVar3;
      ppAVar5 = &this->tail;
      ppAVar4 = &pAVar3->prev;
    }
    if (pAVar3 == (Am_List_Item *)0x0) {
      ppAVar4 = ppAVar5;
    }
    *ppAVar4 = this_00;
  }
  else if (position == Am_BEFORE) {
    pAVar3 = current->prev;
    this_00->prev = pAVar3;
    this_00->next = current;
    current->prev = this_00;
    if (pAVar3 == (Am_List_Item *)0x0) {
      ppAVar2 = &this->head;
    }
    else {
      ppAVar2 = &pAVar3->next;
    }
  }
  else {
    pAVar3 = current->next;
    this_00->next = pAVar3;
    this_00->prev = current;
    current->next = this_00;
    if (pAVar3 == (Am_List_Item *)0x0) {
      ppAVar2 = &this->tail;
    }
    else {
      ppAVar2 = &pAVar3->prev;
    }
  }
  *ppAVar2 = this_00;
  return;
}

Assistant:

void
Am_Value_List_Data::Insert(const Am_Value &value, Am_List_Item *current,
                           Am_Insert_Position position)
{
  ++number;
  Am_List_Item *item = new Am_List_Item;
  *item = value;
  if (current) {
    if (position == Am_BEFORE) {
      item->prev = current->prev;
      item->next = current;
      current->prev = item;
      if (item->prev)
        item->prev->next = item;
      else
        head = item;
    } else {
      item->next = current->next;
      item->prev = current;
      current->next = item;
      if (item->next)
        item->next->prev = item;
      else
        tail = item;
    }
  } else {
    if (position == Am_BEFORE) {
      item->next = nullptr;
      item->prev = tail;
      if (tail)
        tail->next = item;
      else
        head = item;
      tail = item;
    } else {
      item->prev = nullptr;
      item->next = head;
      if (head)
        head->prev = item;
      else
        tail = item;
      head = item;
    }
  }
}